

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O0

void __thiscall mp::ViolSummary::CountViol(ViolSummary *this,Violation viol,double violRel,char *nm)

{
  char *nm_local;
  double violRel_local;
  ViolSummary *this_local;
  Violation viol_local;
  
  this->N_ = this->N_ + 1;
  if (this->epsAbsMax_ < viol.viol_) {
    this->epsAbsMax_ = viol.viol_;
    this->nameAbs_ = nm;
  }
  if (this->epsRelMax_ < violRel) {
    this->epsRelMax_ = violRel;
    this->nameRel_ = nm;
  }
  return;
}

Assistant:

void CountViol(
      Violation viol, double violRel, const char* nm) {
    ++N_;
    if (epsAbsMax_ < viol.viol_) {
      epsAbsMax_ = viol.viol_;
      nameAbs_ = nm;
    }
    if (epsRelMax_ < violRel) {
      epsRelMax_ = violRel;
      nameRel_ = nm;
    }
  }